

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_RepeatedSetFieldTest_Test::TestBody
          (ComparisonTest_RepeatedSetFieldTest_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestAllTypes_RepeatedGroup> *this_00;
  RepeatedPtrField<proto2_unittest::TestAllTypes_RepeatedGroup> *this_01;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>_>
  *pVVar1;
  char *message;
  AssertHelper AStack_58;
  AssertionResult gtest_ar;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"repeatedgroup",(allocator<char> *)&gtest_ar);
  std::__cxx11::string::_M_assign((string *)&(this->super_ComparisonTest).set_field_);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = &(this->super_ComparisonTest).proto1_.field_0._impl_.repeatedgroup_;
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
            (&this_00->super_RepeatedPtrFieldBase);
  this_01 = &(this->super_ComparisonTest).proto2_.field_0._impl_.repeatedgroup_;
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
            (&this_01->super_RepeatedPtrFieldBase);
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                     (&this_01->super_RepeatedPtrFieldBase);
  (pVVar1->field_0)._impl_.a_ = 0x38d;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                     (&this_01->super_RepeatedPtrFieldBase);
  (pVVar1->field_0)._impl_.a_ = 0x38b;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                     (&this_00->super_RepeatedPtrFieldBase);
  (pVVar1->field_0)._impl_.a_ = 0x13d;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                     (&this_00->super_RepeatedPtrFieldBase);
  (pVVar1->field_0)._impl_.a_ = 0x388;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                     (&this_00->super_RepeatedPtrFieldBase);
  (pVVar1->field_0)._impl_.a_ = 0x38b;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                     (&this_00->super_RepeatedPtrFieldBase);
  (pVVar1->field_0)._impl_.a_ = 0x38d;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_(&local_40,this);
  testing::internal::CmpHelperEQ<char[191],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"moved: repeatedgroup[2] -> repeatedgroup[1] : { a: 907 }\\n\" \"moved: repeatedgroup[3] -> repeatedgroup[0] : { a: 909 }\\n\" \"deleted: repeatedgroup[0]: { a: 317 }\\n\" \"deleted: repeatedgroup[1]: { a: 904 }\\n\""
             ,"Run()",(char (*) [191])
                      "moved: repeatedgroup[2] -> repeatedgroup[1] : { a: 907 }\nmoved: repeatedgroup[3] -> repeatedgroup[0] : { a: 909 }\ndeleted: repeatedgroup[0]: { a: 317 }\ndeleted: repeatedgroup[1]: { a: 904 }\n"
             ,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xd3b,message);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ComparisonTest, RepeatedSetFieldTest) {
  field_as_set("repeatedgroup");

  proto1_.clear_repeatedgroup();
  proto2_.clear_repeatedgroup();
  proto2_.add_repeatedgroup()->set_a(909);
  proto2_.add_repeatedgroup()->set_a(907);
  proto1_.add_repeatedgroup()->set_a(317);
  proto1_.add_repeatedgroup()->set_a(904);
  proto1_.add_repeatedgroup()->set_a(907);
  proto1_.add_repeatedgroup()->set_a(909);

  EXPECT_EQ(
      "moved: repeatedgroup[2] -> repeatedgroup[1] : { a: 907 }\n"
      "moved: repeatedgroup[3] -> repeatedgroup[0] : { a: 909 }\n"
      "deleted: repeatedgroup[0]: { a: 317 }\n"
      "deleted: repeatedgroup[1]: { a: 904 }\n",
      Run());
}